

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::IsGroupOf_PDU::~IsGroupOf_PDU(IsGroupOf_PDU *this)

{
  ~IsGroupOf_PDU(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

IsGroupOf_PDU::~IsGroupOf_PDU()
{
    m_vpGED.clear();
}